

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalogManager.cpp
# Opt level: O2

void __thiscall catalog::descTable(catalog *this,string *tableName)

{
  TableInfo *pTVar1;
  uint uVar2;
  int iVar3;
  ostream *poVar4;
  iterator iVar5;
  int local_54;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,(string *)tableName);
  uVar2 = existTable(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if ((int)uVar2 < 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"no such table");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"tableName : ");
    std::operator<<(poVar4,(string *)
                           (this->TableInfoList).
                           super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar2]);
    poVar4 = std::operator<<((ostream *)&std::cout,"\tattributeNum : ");
    poVar4 = (ostream *)
             std::ostream::operator<<
                       (poVar4,(this->TableInfoList).
                               super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>._M_impl
                               .super__Vector_impl_data._M_start[uVar2]->attributeNum);
    std::endl<char,std::char_traits<char>>(poVar4);
    local_54 = 0;
    while( true ) {
      pTVar1 = (this->TableInfoList).super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar2];
      if (pTVar1->attributeNum <= local_54) break;
      poVar4 = std::operator<<((ostream *)&std::cout,
                               (string *)
                               ((long)local_54 * 0x20 +
                               *(long *)&(pTVar1->attributeName).
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data));
      poVar4 = std::operator<<(poVar4,"\t");
      poVar4 = (ostream *)
               std::ostream::operator<<
                         (poVar4,*(int *)(*(long *)&((this->TableInfoList).
                                                                                                          
                                                  super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar2]->
                                                  type).
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data +
                                         (long)local_54 * 4));
      poVar4 = std::operator<<(poVar4,"\t");
      std::ostream::operator<<
                (poVar4,*(int *)(*(long *)&((this->TableInfoList).
                                            super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start[uVar2]->
                                           constraint).super__Vector_base<int,_std::allocator<int>_>
                                           ._M_impl.super__Vector_impl_data + (long)local_54 * 4));
      iVar3 = *(int *)(*(long *)&((this->TableInfoList).
                                  super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar2]->constraint).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data + (long)local_54 * 4);
      if (iVar3 == 3) {
        std::operator<<((ostream *)&std::cout,"\tprimary key ");
        iVar3 = *(int *)(*(long *)&((this->TableInfoList).
                                    super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start[uVar2]->constraint).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data + (long)local_54 * 4);
      }
      if (iVar3 == 4) {
        poVar4 = std::operator<<((ostream *)&std::cout,"\tindex ");
        iVar5 = std::
                _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::find(&((this->TableInfoList).
                         super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar2]->indexInfo)._M_t,&local_54);
        std::operator<<(poVar4,(string *)&iVar5._M_node[1]._M_parent);
      }
      std::operator<<((ostream *)&std::cout,"\n");
      local_54 = local_54 + 1;
    }
  }
  return;
}

Assistant:

void catalog::descTable(std::string tableName){
    int pos = existTable(tableName);
    if(pos < 0){
        std::cout<<"no such table"<<std::endl;
        return;
    }
    std::cout<<"tableName : "<<TableInfoList[pos]->tableName;
    std::cout<<"\tattributeNum : "<<TableInfoList[pos]->attributeNum<<std::endl;
    for(int j = 0 ; j < TableInfoList[pos]->attributeNum; j ++){
        std::cout<<TableInfoList[pos]->attributeName[j] << "\t"<<TableInfoList[pos]->type[j] << "\t"<<TableInfoList[pos]->constraint[j];
        if(TableInfoList[pos]->constraint[j] == 3)std::cout<<"\tprimary key ";
        if(TableInfoList[pos]->constraint[j] == 4)std::cout<<"\tindex "<<TableInfoList[pos]->indexInfo.find(j)->second;
        std::cout<<"\n";
    }

}